

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.cpp
# Opt level: O0

ProgramBinary *
vk::anon_unknown_6::createProgramBinaryFromSpirV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  bool bVar1;
  ProgramBinary *this;
  size_type sVar2;
  const_reference binary_00;
  InternalError *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *binary_local;
  
  bVar1 = isNativeSpirVBinaryEndianness();
  if (!bVar1) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"SPIR-V endianness translation not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkPrograms.cpp"
               ,100);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  this = (ProgramBinary *)operator_new(0x20);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(binary);
  binary_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](binary,0);
  ProgramBinary::ProgramBinary(this,PROGRAM_FORMAT_SPIRV,sVar2 << 2,(deUint8 *)binary_00);
  return this;
}

Assistant:

ProgramBinary* createProgramBinaryFromSpirV (const vector<deUint32>& binary)
{
	DE_ASSERT(!binary.empty());

	if (isNativeSpirVBinaryEndianness())
		return new ProgramBinary(PROGRAM_FORMAT_SPIRV, binary.size()*sizeof(deUint32), (const deUint8*)&binary[0]);
	else
		TCU_THROW(InternalError, "SPIR-V endianness translation not supported");
}